

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
phyr::Film::mergeFilmTile
          (Film *this,unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *tile)

{
  FilmTile *pFVar1;
  Point2<int> PVar2;
  long lVar3;
  Pixel *pPVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double xyz [3];
  double local_48;
  double local_40;
  double local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar5 == 0) {
    pFVar1 = (tile->_M_t).
             super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>._M_t.
             super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>.
             super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl;
    uVar10 = *(ulong *)&(pFVar1->pixelBounds).pMin;
    PVar2 = (pFVar1->pixelBounds).pMax;
    iVar14 = PVar2.y;
    iVar12 = (int)uVar10;
    uVar6 = PVar2.x;
    uVar7 = uVar10 >> 0x20;
    iVar9 = (int)(uVar10 >> 0x20);
    iVar5 = iVar14;
    if (iVar14 < iVar9) {
      iVar5 = iVar9;
    }
    if (iVar9 < iVar14 && iVar12 < (int)uVar6) {
      uVar8 = uVar10 & 0xffffffff;
      uVar15 = uVar10 & 0xffffffff;
      do {
        pFVar1 = (tile->_M_t).
                 super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>._M_t.
                 super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>.
                 super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl;
        uVar11 = uVar10 & 0xffffffff00000000;
        iVar9 = (pFVar1->pixelBounds).pMin.x;
        iVar14 = (int)uVar15;
        lVar3 = *(long *)&(pFVar1->pixels).
                          super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>
                          ._M_impl;
        lVar13 = (long)((iVar14 - iVar9) +
                       ((pFVar1->pixelBounds).pMax.x - iVar9) *
                       ((int)uVar7 - *(int *)((long)&(pFVar1->pixelBounds).pMin + 4))) * 0x1e8;
        iVar9 = (this->croppedImageBounds).pMin.x;
        iVar9 = (iVar14 - iVar9) +
                ((int)uVar7 - (this->croppedImageBounds).pMin.y) *
                ((this->croppedImageBounds).pMax.x - iVar9);
        pPVar4 = (this->pixels)._M_t.
                 super___uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>
                 .super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl;
        SampledSpectrum::toXYZConstants((SampledSpectrum *)(lVar13 + lVar3),&local_48);
        pPVar4[iVar9].xyz[0] = local_48 + pPVar4[iVar9].xyz[0];
        pPVar4[iVar9].xyz[1] = local_40 + pPVar4[iVar9].xyz[1];
        pPVar4[iVar9].xyz[2] = local_38 + pPVar4[iVar9].xyz[2];
        uVar10 = uVar11 + uVar8 + 0x100000000;
        if (iVar14 + 1U != uVar6) {
          uVar10 = uVar11 + (iVar14 + 1U);
        }
        pPVar4[iVar9].filterWeightSum =
             *(double *)(lVar3 + 0x1e0 + lVar13) + pPVar4[iVar9].filterWeightSum;
        uVar7 = uVar10 >> 0x20;
        uVar15 = uVar10;
      } while ((iVar12 != (int)uVar10) || (iVar5 != (int)(uVar10 >> 0x20)));
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void Film::mergeFilmTile(std::unique_ptr<FilmTile> tile) {
    // Acquire lock
    std::lock_guard<std::mutex> lock(mutex);

    // Iterate through all pixels within pixel bounds
    for (Point2i pixel : tile->getPixelBounds()) {
        // Merge pixel into {Film::pixels}
        FilmTilePixel& tilePixel = tile->getPixel(pixel);
        Pixel& filmPixel = getPixel(pixel);

        // Get xyz spectrum data
        Real xyz[3];
        tilePixel.contributionSum.toXYZConstants(xyz);
        // Add spectrum data to {filmPixel}
        filmPixel.xyz[0] += xyz[0]; filmPixel.xyz[1] += xyz[1];
        filmPixel.xyz[2] += xyz[2];
        filmPixel.filterWeightSum += tilePixel.filterWeightSum;
    }
}